

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O2

void helics::fileops::replaceIfMember(value *element,string *key,string *loc)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  value *element_00;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  string local_1d0;
  basic_value<toml::type_config> local_1b0;
  basic_value<toml::type_config> local_e8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_e8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>(element,key,&local_e8);
  toml::basic_value<toml::type_config>::basic_value(&local_1b0,v);
  if (local_1b0.type_ != empty) {
    tomlAsString_abi_cxx11_(&local_1d0,(fileops *)&local_1b0,element_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  toml::basic_value<toml::type_config>::~basic_value(&local_1b0);
  toml::basic_value<toml::type_config>::~basic_value(&local_e8);
  return;
}

Assistant:

inline void replaceIfMember(const toml::value& element, const std::string& key, std::string& loc)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        loc = tomlAsString(val);
    }
}